

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_get.c
# Opt level: O1

int test_get_number(unsigned_long number)

{
  char *pcVar1;
  char *pcVar2;
  
  test_get_request = (nhr_request)nhr_request_create();
  nhr_request_set_url(test_get_request,"http","httpbin.org",
                      &DAT_00105018 + (int)(&UINT_00105014)[number],0x50);
  nhr_request_set_method(test_get_request,1);
  nhr_request_set_timeout(test_get_request,10);
  nhr_request_set_user_object(test_get_request,number);
  nhr_request_add_header_field(test_get_request,"Cache-control","no-cache");
  nhr_request_add_header_field(test_get_request,"Accept-Charset","utf-8");
  nhr_request_add_header_field(test_get_request,"Accept","application/json");
  nhr_request_add_header_field(test_get_request,"Connection","close");
  nhr_request_add_header_field(test_get_request,"User-Agent","CMake tests");
  switch(number) {
  case 1:
    pcVar2 = "test_get_param_name1";
    pcVar1 = "test_get_param_value1";
    break;
  case 2:
    pcVar1 = "/deflate";
    goto LAB_0010249d;
  case 3:
    pcVar1 = "/gzip";
LAB_0010249d:
    nhr_request_add_header_field(test_get_request,"Accept-Encoding",pcVar1 + 1);
  default:
    goto switchD_00102458_caseD_4;
  case 5:
    nhr_request_set_timeout(test_get_request,0x14);
    nhr_request_add_parameter(test_get_request,"duration","1");
    pcVar2 = "chunk_size";
    pcVar1 = "375";
  }
  nhr_request_add_parameter(test_get_request,pcVar2,pcVar1);
switchD_00102458_caseD_4:
  nhr_request_set_on_recvd_response(test_get_request,test_get_on_response);
  nhr_request_set_on_error(test_get_request,test_get_on_error);
  test_get_working = nhr_request_send(test_get_request);
  test_get_error = (uint)(test_get_working == '\0') << 2;
  while (test_get_working != '\0') {
    nhr_thread_sleep(0x14);
  }
  nhr_thread_sleep(0x342);
  return test_get_error;
}

Assistant:

static int test_get_number(unsigned long number) {

	test_get_request = nhr_request_create();

	switch (number) {
		case 1: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/get", 80); break;
		case 2: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/deflate", 80); break;
		case 3: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/gzip", 80); break;
		case 4: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/status/418", 80); break;
		case 5: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/range/1024", 80); break;
		default:
			break;
	}


	nhr_request_set_method(test_get_request, nhr_method_GET);
	nhr_request_set_timeout(test_get_request, 10);

	nhr_request_set_user_object(test_get_request, (void*)number);

	nhr_request_add_header_field(test_get_request, "Cache-control", "no-cache");
	nhr_request_add_header_field(test_get_request, "Accept-Charset", "utf-8");
	nhr_request_add_header_field(test_get_request, "Accept", "application/json");
	nhr_request_add_header_field(test_get_request, "Connection", "close");
	nhr_request_add_header_field(test_get_request, "User-Agent", "CMake tests");

	switch (number) {
		case 1:
			nhr_request_add_parameter(test_get_request, test_get_param_name1, test_get_param_value1);
			break;

		case 2:
			nhr_request_add_header_field(test_get_request, "Accept-Encoding", k_nhr_deflate);
			break;

		case 3:
			nhr_request_add_header_field(test_get_request, "Accept-Encoding", k_nhr_gzip);
			break;

		case 5:
			// chunked, total 1024, chunk_size 375, delay 1
			nhr_request_set_timeout(test_get_request, 20); // increase default delay
			nhr_request_add_parameter(test_get_request, "duration", "1");
			nhr_request_add_parameter(test_get_request, "chunk_size", "375");
		default:
			break;
	}

	nhr_request_set_on_recvd_response(test_get_request, &test_get_on_response);
	nhr_request_set_on_error(test_get_request, &test_get_on_error);
	test_get_working = nhr_request_send(test_get_request);

	if (test_get_working) test_get_error = 0;
	else test_get_error = 4;

	while (test_get_working) {
		nhr_thread_sleep(20);
	}

	nhr_thread_sleep(834); // just delay between requests

	return test_get_error;
}